

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

Quat rw::slerp(Quat *q,Quat *p,float32 a)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float32 fVar5;
  float32 fVar6;
  float fVar7;
  float32 fVar8;
  Quat QVar9;
  Quat local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  float32 local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  uVar1 = q->x;
  uVar2 = q->y;
  uVar3 = q->z;
  uVar4 = q->w;
  local_58 = *q;
  fVar7 = (float)uVar3 * (float)p->z +
          (float)uVar2 * (float)p->y + (float)uVar4 * (float)p->w + (float)uVar1 * (float)p->x;
  local_28 = a;
  if (fVar7 < 0.0) {
    local_38 = -fVar7;
    uStack_34 = 0x80000000;
    uStack_30 = 0x80000000;
    uStack_2c = 0x80000000;
    local_58 = negate(&local_58);
    fVar7 = local_38;
  }
  local_48 = acosf(fVar7);
  if (local_48 <= 1e-05) {
    fVar5 = local_58.x;
    fVar6 = local_58.y;
    local_28 = local_58.z;
    fVar8 = local_58.w;
  }
  else {
    local_38 = sinf(local_48);
    fStack_3c = sinf((1.0 - (float)local_28) * local_48);
    fStack_3c = fStack_3c / local_38;
    fVar7 = local_48 * (float)local_28;
    local_28 = (float32)((float)local_58.z * fStack_3c);
    fStack_24 = (float)local_58.w * fStack_3c;
    fStack_20 = fStack_3c * 0.0;
    fStack_1c = fStack_3c * 0.0;
    local_48 = fStack_3c * (float)local_58.x;
    fStack_44 = fStack_3c * (float)local_58.y;
    fStack_40 = fStack_3c * 0.0;
    fStack_3c = fStack_3c * 0.0;
    fVar7 = sinf(fVar7);
    QVar9 = scale(p,(float32)(fVar7 / local_38));
    fVar5 = (float32)((float)QVar9.x + local_48);
    fVar6 = (float32)((float)QVar9.y + fStack_44);
    local_28 = (float32)((float)QVar9.z + (float)local_28);
    fVar8 = (float32)((float)QVar9.w + fStack_24);
  }
  QVar9.y = fVar6;
  QVar9.x = fVar5;
  QVar9.w = fVar8;
  QVar9.z = local_28;
  return QVar9;
}

Assistant:

Quat
slerp(const Quat &q, const Quat &p, float32 a)
{
	float32 c;
	Quat q1 = q;
	c = dot(q1, p);
	if(c < 0.0f){
		c = -c;
		q1 = negate(q1);
	}
	float32 phi = acosf(c);
	if(phi > 0.00001f){
		float32 s = sinf(phi);
		return add(scale(q1, sinf((1.0f-a)*phi)/s),
		           scale(p,  sinf(a*phi)/s));
	}
	return q1;
}